

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# passkey.cpp
# Opt level: O3

int main(int argc,char **argv)

{
  ggml_backend_dev_t *ppgVar1;
  uint __len_00;
  ulong uVar2;
  float ***pppfVar3;
  llama_token *plVar4;
  llama_token *plVar5;
  bool bVar6;
  undefined1 uVar7;
  byte bVar8;
  int iVar9;
  llama_token lVar10;
  long *plVar11;
  undefined8 *puVar12;
  undefined8 uVar13;
  common_log *pcVar14;
  size_type *psVar15;
  float ***pppfVar16;
  long *plVar17;
  long lVar18;
  long lVar19;
  uint uVar20;
  uint uVar21;
  ulong uVar22;
  float **ppfVar23;
  int *piVar24;
  ulong uVar25;
  uint __uval;
  int iVar26;
  uint __len;
  int iVar27;
  llama_context *plVar28;
  float fVar29;
  initializer_list<int> __l;
  initializer_list<int> __l_00;
  initializer_list<int> __l_01;
  llama_batch batch;
  string __str;
  string prompt_prefix;
  string prompt_suffix;
  llama_model_params model_params;
  llama_context_params ctx_params;
  common_params params;
  int local_1638 [2];
  int iStack_1630;
  undefined4 uStack_162c;
  undefined4 local_1628;
  undefined4 uStack_1624;
  int iStack_1620;
  undefined4 uStack_161c;
  int local_1618;
  undefined4 uStack_1614;
  undefined4 uStack_1610;
  undefined4 uStack_160c;
  int8_t *local_1608;
  uint local_15b4;
  llama_context *local_15b0;
  ulong local_15a8;
  ulong local_15a0;
  int local_1594;
  ulong local_1590;
  int local_1584;
  ulong local_1580;
  string local_1578;
  ulong local_1558;
  ulong local_1550;
  uint local_1544;
  ulong local_1540;
  float ***local_1538;
  llama_batch local_1530;
  float ***local_14f8;
  ulong local_14f0;
  uint local_14e8;
  uint local_14e4;
  float ***local_14e0;
  long local_14d8;
  float **local_14d0 [2];
  undefined8 local_14c0;
  long *local_14b8 [2];
  long local_14a8 [2];
  string local_1498;
  float **local_1478;
  long local_1470;
  long *local_1468 [2];
  long local_1458 [2];
  undefined1 local_1448 [16];
  ggml_backend_dev_t local_1438 [7];
  long local_1400;
  undefined8 local_13f8;
  llama_context_params local_13f0;
  undefined1 local_1378 [3616];
  string local_558 [36];
  undefined8 local_c0;
  
  bVar8 = 0;
  common_params::common_params((common_params *)local_1378);
  local_c0._0_4_ = 0xfa;
  local_c0._4_4_ = -1;
  local_1378._16_4_ = 0x20;
  bVar6 = common_params_parse(argc,argv,(common_params *)local_1378,LLAMA_EXAMPLE_PASSKEY,
                              print_usage);
  iVar9 = 1;
  if (bVar6) {
    common_init();
    local_1594 = (int32_t)local_c0;
    local_14f0 = (ulong)(uint)local_1378._16_4_;
    local_1580 = (ulong)(uint)local_1378._32_4_;
    local_1584 = local_c0._4_4_;
    if (local_c0._4_4_ == -1) {
      local_1584 = rand();
      local_1584 = local_1584 % local_1594;
    }
    local_1498._M_dataplus._M_p = (pointer)&local_1498.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_1498,
               "There is an important info hidden inside a lot of irrelevant text. Find it and memorize them. I will quiz you about the important information there."
               ,"");
    local_1468[0] = local_1458;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_1468," What is the pass key? The pass key is","");
    std::__cxx11::string::_M_assign((string *)(local_1378 + 0xe20));
    iVar9 = rand();
    local_14e8 = iVar9 % 50000 + 1;
    if (0 < local_1594) {
      uVar20 = -local_14e8;
      if (0 < (int)local_14e8) {
        uVar20 = local_14e8;
      }
      local_1590 = (ulong)(uint)-((int)local_14e8 >> 0x1f);
      pppfVar3 = (float ***)&local_1530.embd;
      uVar21 = 3;
      if (uVar20 < 100) {
        uVar21 = 2 - (uVar20 < 10);
      }
      __len_00 = 5 - (uVar20 < 10000);
      if (uVar20 < 1000) {
        __len_00 = uVar21;
      }
      local_15a0 = (ulong)(-((int)local_14e8 >> 0x1f) + __len_00);
      iVar9 = 0;
      do {
        if (local_1584 == iVar9) {
          local_14b8[0] = local_14a8;
          std::__cxx11::string::_M_construct((ulong)local_14b8,(char)local_15a0);
          std::__detail::__to_chars_10_impl<unsigned_int>
                    ((char *)((long)local_14b8[0] + local_1590),__len_00,uVar20);
          plVar11 = (long *)std::__cxx11::string::replace((ulong)local_14b8,0,(char *)0x0,0x21019c);
          local_1578._M_dataplus._M_p = (pointer)&local_1578.field_2;
          psVar15 = (size_type *)(plVar11 + 2);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)*plVar11 ==
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)psVar15) {
            local_1578.field_2._M_allocated_capacity = *psVar15;
            local_1578.field_2._8_8_ = plVar11[3];
          }
          else {
            local_1578.field_2._M_allocated_capacity = *psVar15;
            local_1578._M_dataplus._M_p = (pointer)*plVar11;
          }
          local_1578._M_string_length = plVar11[1];
          *plVar11 = (long)psVar15;
          plVar11[1] = 0;
          *(undefined1 *)(plVar11 + 2) = 0;
          plVar11 = (long *)std::__cxx11::string::append((char *)&local_1578);
          pppfVar16 = (float ***)(plVar11 + 2);
          if ((float ***)*plVar11 == pppfVar16) {
            local_1530.embd = (float *)*pppfVar16;
            local_1530.pos = (llama_pos *)plVar11[3];
            local_1530._0_8_ = pppfVar3;
          }
          else {
            local_1530.embd = (float *)*pppfVar16;
            local_1530._0_8_ = (float ***)*plVar11;
          }
          local_1530.token = (llama_token *)plVar11[1];
          *plVar11 = (long)pppfVar16;
          plVar11[1] = 0;
          *(undefined1 *)(plVar11 + 2) = 0;
          local_14e0 = local_14d0;
          std::__cxx11::string::_M_construct((ulong)&local_14e0,(char)local_15a0);
          std::__detail::__to_chars_10_impl<unsigned_int>
                    ((char *)((long)local_14e0 + local_1590),__len_00,uVar20);
          ppfVar23 = (float **)0xf;
          if ((float ***)local_1530._0_8_ != pppfVar3) {
            ppfVar23 = (float **)local_1530.embd;
          }
          if (ppfVar23 < (float **)(local_14d8 + (long)local_1530.token)) {
            ppfVar23 = (float **)0xf;
            if (local_14e0 != local_14d0) {
              ppfVar23 = local_14d0[0];
            }
            if (ppfVar23 < (float **)(local_14d8 + (long)local_1530.token)) goto LAB_00125453;
            puVar12 = (undefined8 *)
                      std::__cxx11::string::replace
                                ((ulong)&local_14e0,0,(char *)0x0,local_1530._0_8_);
          }
          else {
LAB_00125453:
            puVar12 = (undefined8 *)
                      std::__cxx11::string::_M_append((char *)&local_1530,(ulong)local_14e0);
          }
          local_1448._0_8_ = local_1438;
          ppgVar1 = (ggml_backend_dev_t *)(puVar12 + 2);
          if ((ggml_backend_dev_t *)*puVar12 == ppgVar1) {
            local_1438[0] = *ppgVar1;
            local_1438[1] = (ggml_backend_dev_t)puVar12[3];
          }
          else {
            local_1438[0] = *ppgVar1;
            local_1448._0_8_ = (ggml_backend_dev_t *)*puVar12;
          }
          local_1448._8_8_ = puVar12[1];
          *puVar12 = ppgVar1;
          puVar12[1] = 0;
          *(undefined1 *)ppgVar1 = 0;
          plVar11 = (long *)std::__cxx11::string::append(local_1448);
          local_13f0._0_8_ = &local_13f0.n_threads;
          plVar17 = plVar11 + 2;
          if ((long *)*plVar11 == plVar17) {
            local_13f0._16_8_ = *plVar17;
            local_13f0._24_8_ = plVar11[3];
          }
          else {
            local_13f0._16_8_ = *plVar17;
            local_13f0._0_8_ = (long *)*plVar11;
          }
          local_13f0._8_8_ = plVar11[1];
          *plVar11 = (long)plVar17;
          plVar11[1] = 0;
          *(undefined1 *)(plVar11 + 2) = 0;
          std::__cxx11::string::_M_append(local_1378 + 0xe20,local_13f0._0_8_);
          if ((int32_t *)local_13f0._0_8_ != &local_13f0.n_threads) {
            operator_delete((void *)local_13f0._0_8_,local_13f0._16_8_ + 1);
          }
          if ((ggml_backend_dev_t *)local_1448._0_8_ != local_1438) {
            operator_delete((void *)local_1448._0_8_,(ulong)(local_1438[0] + 1));
          }
          if (local_14e0 != local_14d0) {
            operator_delete(local_14e0,(long)local_14d0[0] + 1);
          }
          if ((float ***)local_1530._0_8_ != pppfVar3) {
            operator_delete((void *)local_1530._0_8_,(long)local_1530.embd + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_1578._M_dataplus._M_p != &local_1578.field_2) {
            operator_delete(local_1578._M_dataplus._M_p,local_1578.field_2._M_allocated_capacity + 1
                           );
          }
          if (local_14b8[0] != local_14a8) {
            operator_delete(local_14b8[0],local_14a8[0] + 1);
          }
        }
        std::__cxx11::string::append(local_1378 + 0xe20);
        iVar9 = iVar9 + 1;
      } while (local_1594 != iVar9);
    }
    std::__cxx11::string::_M_append(local_1378 + 0xe20,(ulong)local_1468[0]);
    llama_backend_init();
    llama_numa_init(local_1378._1712_4_);
    common_model_params_to_llama((llama_model_params *)local_1448,(common_params *)local_1378);
    puVar12 = (undefined8 *)local_1448;
    piVar24 = local_1638;
    for (lVar18 = 9; lVar18 != 0; lVar18 = lVar18 + -1) {
      *(undefined8 *)piVar24 = *puVar12;
      puVar12 = puVar12 + (ulong)bVar8 * -2 + 1;
      piVar24 = (int *)((long)piVar24 + ((ulong)bVar8 * -2 + 1) * 8);
    }
    lVar18 = llama_model_load_from_file(local_1378._3424_8_);
    if (lVar18 == 0) {
      iVar9 = 1;
      if (-1 < common_log_verbosity_thold) {
        pcVar14 = common_log_main();
        common_log_add(pcVar14,GGML_LOG_LEVEL_ERROR,"%s: unable to load model\n","main");
      }
    }
    else {
      local_13f8 = llama_model_get_vocab(lVar18);
      common_context_params_to_llama(&local_13f0,(common_params *)local_1378);
      iVar9 = llama_model_n_ctx_train(lVar18);
      local_13f0.n_ctx = iVar9 * (int)local_1580 + (int)local_14f0;
      if ((int)((ulong)local_13f0.n_batch % (local_1580 & 0xffffffff)) != 0) {
        ggml_abort("/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]llama/examples/passkey/passkey.cpp"
                   ,0x52,"GGML_ASSERT(%s) failed",
                   "ctx_params.n_batch % n_grp == 0 && \"n_batch must be divisible by n_grp\"");
      }
      puVar12 = (undefined8 *)&local_13f0;
      piVar24 = local_1638;
      for (lVar19 = 0xf; lVar19 != 0; lVar19 = lVar19 + -1) {
        *(undefined8 *)piVar24 = *puVar12;
        puVar12 = puVar12 + (ulong)bVar8 * -2 + 1;
        piVar24 = (int *)((long)piVar24 + ((ulong)bVar8 * -2 + 1) * 8);
      }
      local_15b0 = (llama_context *)llama_init_from_model(lVar18);
      if (local_15b0 == (llama_context *)0x0) {
        iVar9 = 1;
        if (-1 < common_log_verbosity_thold) {
          pcVar14 = common_log_main();
          common_log_add(pcVar14,GGML_LOG_LEVEL_ERROR,"%s: failed to create the llama_context\n",
                         "main");
        }
      }
      else {
        uVar7 = llama_sampler_chain_default_params();
        local_14c0 = llama_sampler_chain_init(uVar7);
        uVar13 = llama_sampler_init_greedy();
        llama_sampler_chain_add(local_14c0,uVar13);
        plVar28 = local_15b0;
        common_tokenize((vector<int,_std::allocator<int>_> *)&local_1530,local_15b0,
                        (string *)(local_1378 + 0xe20),true,false);
        plVar4 = local_1530.token;
        local_14f8 = (float ***)local_1530._0_8_;
        local_1478 = (float **)local_1530.embd;
        common_tokenize((vector<int,_std::allocator<int>_> *)&local_1530,plVar28,&local_1498,true,
                        false);
        plVar5 = local_1530.token;
        uVar13 = local_1530._0_8_;
        if ((float ***)local_1530._0_8_ != (float ***)0x0) {
          operator_delete((void *)local_1530._0_8_,(long)local_1530.embd - local_1530._0_8_);
        }
        plVar28 = local_15b0;
        local_15b4 = llama_n_ctx(local_15b0);
        iVar9 = llama_n_ctx(plVar28);
        local_1558 = (ulong)((long)plVar4 - (long)local_14f8) >> 2;
        local_14e4 = (int)local_1558 + 0x10;
        local_15b4 = local_15b4 - (int)local_14f0;
        local_1550 = (ulong)(int)local_13f0.n_batch;
        local_1544 = local_13f0.n_batch / (uint)local_1580;
        if (-1 < common_log_verbosity_thold) {
          pcVar14 = common_log_main();
          local_1618 = local_1584;
          iStack_1620 = local_1594;
          local_1628 = (undefined4)local_1550;
          iStack_1630 = (int)local_1580;
          local_1638[0] = iVar9;
          common_log_add(pcVar14,GGML_LOG_LEVEL_INFO,
                         "\n%s: n_len = %d, n_ctx = %d, n_kv_req = %d, n_grp = %d, n_batch = %d, n_junk = %d, i_pos = %d\n"
                         ,"main",(ulong)local_14e4,(ulong)local_15b4);
          if (-1 < common_log_verbosity_thold) {
            pcVar14 = common_log_main();
            common_log_add(pcVar14,GGML_LOG_LEVEL_INFO,"\n");
            if (-1 < common_log_verbosity_thold) {
              pcVar14 = common_log_main();
              common_log_add(pcVar14,GGML_LOG_LEVEL_INFO,"prefix tokens: %d\n",
                             (ulong)((long)plVar5 - uVar13) >> 2 & 0xffffffff);
              if (-1 < common_log_verbosity_thold) {
                pcVar14 = common_log_main();
                common_log_add(pcVar14,GGML_LOG_LEVEL_INFO,"prompt tokens: %d\n",local_1558);
              }
            }
          }
        }
        local_1400 = lVar18;
        llama_batch_init(&local_1530,local_1378._8_4_,0,1);
        local_1590 = local_1550 & 0xffffffff;
        local_1544 = local_1544 * ((int)local_1580 + -1);
        local_15a0 = (ulong)(int)local_1558;
        local_1540 = (ulong)(int)local_15b4;
        local_1470 = local_1550 * 4;
        local_1538 = local_14f8;
        local_15a8 = 0;
        uVar22 = 0;
        plVar28 = local_15b0;
        do {
          if ((long)local_1540 <= (long)uVar22) break;
          if (0 < (long)uVar22 && 1 < (int)(uint)local_1580) {
            iVar26 = ((int)((long)((ulong)(uint)((int)uVar22 >> 0x1f) << 0x20 | uVar22 & 0xffffffff)
                           / (long)(int)local_1590) + -1) * local_1544;
            iVar27 = (int)local_15a8;
            iVar9 = iVar27 - (int)local_1550;
            llama_kv_self_seq_add(plVar28,0,iVar9,local_15a8 & 0xffffffff,iVar26);
            llama_kv_self_seq_div(plVar28,0,iVar9 + iVar26,iVar27 + iVar26);
            llama_kv_self_update(plVar28);
            iVar9 = llama_kv_self_seq_pos_max(plVar28);
            local_15a8 = (ulong)(iVar9 + 1);
          }
          common_batch_clear(&local_1530);
          if (0 < (int)local_1550) {
            iVar9 = (int)local_15a8;
            uVar25 = 0;
            do {
              if ((long)local_15a0 <= (long)(uVar22 + uVar25)) break;
              lVar10 = *(llama_token *)((long)local_1538 + uVar25 * 4);
              local_14b8[0] = (long *)((ulong)local_14b8[0] & 0xffffffff00000000);
              __l._M_len = 1;
              __l._M_array = (iterator)local_14b8;
              std::vector<int,_std::allocator<int>_>::vector
                        ((vector<int,_std::allocator<int>_> *)&local_1578,__l,
                         (allocator_type *)&local_14e0);
              common_batch_add(&local_1530,lVar10,iVar9 + (int)uVar25,
                               (vector<int,_std::allocator<int>_> *)&local_1578,false);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_1578._M_dataplus._M_p !=
                  (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)0x0) {
                operator_delete(local_1578._M_dataplus._M_p,
                                local_1578.field_2._M_allocated_capacity -
                                (long)local_1578._M_dataplus._M_p);
              }
              uVar25 = uVar25 + 1;
            } while (local_1590 != uVar25);
            local_15a8 = (ulong)(uint)((int)local_15a8 + (int)uVar25);
            plVar28 = local_15b0;
          }
          uVar25 = uVar22 + local_1550;
          if ((long)local_15a0 <= (long)uVar25) {
            local_1530.logits[(long)local_1530.n_tokens + -1] = '\x01';
          }
          local_1608 = local_1530.logits;
          local_1618 = (int)local_1530.n_seq_id;
          uStack_1614 = local_1530.n_seq_id._4_4_;
          uStack_1610 = local_1530.seq_id._0_4_;
          uStack_160c = local_1530.seq_id._4_4_;
          local_1628 = local_1530.embd._0_4_;
          uStack_1624 = local_1530.embd._4_4_;
          iStack_1620 = (int)local_1530.pos;
          uStack_161c = local_1530.pos._4_4_;
          local_1638[0] = local_1530.n_tokens;
          local_1638[1] = local_1530._4_4_;
          iStack_1630 = (int)local_1530.token;
          uStack_162c = local_1530.token._4_4_;
          iVar9 = llama_decode(plVar28);
          if (iVar9 != 0) {
            iVar9 = 1;
            if (-1 < common_log_verbosity_thold) {
              pcVar14 = common_log_main();
              common_log_add(pcVar14,GGML_LOG_LEVEL_INFO,"%s: llama_decode() failed\n","main");
            }
            goto LAB_00126475;
          }
          if (-1 < common_log_verbosity_thold) {
            pcVar14 = common_log_main();
            uVar2 = local_1558;
            if ((int)uVar25 < (int)local_1558) {
              uVar2 = uVar25;
            }
            common_log_add(pcVar14,GGML_LOG_LEVEL_INFO,"%s: processed: [%6d, %6d)\n","main",
                           uVar22 & 0xffffffff,uVar2 & 0xffffffff);
          }
          local_1538 = (float ***)((long)local_1538 + local_1470);
          uVar22 = uVar25;
        } while ((long)uVar25 < (long)local_15a0);
        uVar20 = (uint)local_15a8;
        if ((int)local_15b4 < (int)local_1558) {
          local_1538 = (float ***)CONCAT44(local_1538._4_4_,(int)local_14f0 + (int)local_1550);
          local_1580 = CONCAT44(local_1580._4_4_,-(int)local_1590);
          lVar18 = (long)local_14f8 + local_1540 * 4;
          do {
            if (-1 < common_log_verbosity_thold) {
              pcVar14 = common_log_main();
              common_log_add(pcVar14,GGML_LOG_LEVEL_INFO,"%s: shifting KV cache with %d\n","main",
                             local_1590);
            }
            llama_kv_self_seq_rm(plVar28,0,local_14f0,(ulong)local_1538 & 0xffffffff);
            llama_kv_self_seq_add(plVar28,0,(ulong)local_1538 & 0xffffffff,local_15b4);
            llama_kv_self_update(plVar28);
            iVar9 = llama_kv_self_seq_pos_max(plVar28);
            common_batch_clear(&local_1530);
            uVar20 = iVar9 + 1;
            if (0 < (int)local_1590) {
              uVar22 = 0;
              local_15a8 = (ulong)uVar20;
              do {
                if ((long)local_15a0 <= (long)(local_1540 + uVar22)) break;
                lVar10 = *(llama_token *)(lVar18 + uVar22 * 4);
                local_14b8[0] = (long *)((ulong)local_14b8[0] & 0xffffffff00000000);
                __l_00._M_len = 1;
                __l_00._M_array = (iterator)local_14b8;
                std::vector<int,_std::allocator<int>_>::vector
                          ((vector<int,_std::allocator<int>_> *)&local_1578,__l_00,
                           (allocator_type *)&local_14e0);
                common_batch_add(&local_1530,lVar10,uVar20 + (int)uVar22,
                                 (vector<int,_std::allocator<int>_> *)&local_1578,false);
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_1578._M_dataplus._M_p !=
                    (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)0x0) {
                  operator_delete(local_1578._M_dataplus._M_p,
                                  local_1578.field_2._M_allocated_capacity -
                                  (long)local_1578._M_dataplus._M_p);
                }
                uVar22 = uVar22 + 1;
              } while (local_1590 != uVar22);
              uVar20 = (int)local_15a8 + (int)uVar22;
              plVar28 = local_15b0;
            }
            uVar22 = local_1540 + local_1550;
            if ((long)local_15a0 <= (long)uVar22) {
              local_1530.logits[(long)local_1530.n_tokens + -1] = '\x01';
            }
            local_1608 = local_1530.logits;
            local_1618 = (int)local_1530.n_seq_id;
            uStack_1614 = local_1530.n_seq_id._4_4_;
            uStack_1610 = local_1530.seq_id._0_4_;
            uStack_160c = local_1530.seq_id._4_4_;
            local_1628 = local_1530.embd._0_4_;
            uStack_1624 = local_1530.embd._4_4_;
            iStack_1620 = (int)local_1530.pos;
            uStack_161c = local_1530.pos._4_4_;
            local_1638[0] = local_1530.n_tokens;
            local_1638[1] = local_1530._4_4_;
            iStack_1630 = (int)local_1530.token;
            uStack_162c = local_1530.token._4_4_;
            iVar9 = llama_decode(plVar28);
            if (iVar9 != 0) {
              iVar9 = 1;
              if (-1 < common_log_verbosity_thold) {
                pcVar14 = common_log_main();
                common_log_add(pcVar14,GGML_LOG_LEVEL_ERROR,"%s: llama_decode() failed\n","main");
              }
              goto LAB_00126475;
            }
            if (-1 < common_log_verbosity_thold) {
              pcVar14 = common_log_main();
              uVar25 = local_1558;
              if ((int)uVar22 < (int)local_1558) {
                uVar25 = uVar22;
              }
              common_log_add(pcVar14,GGML_LOG_LEVEL_INFO,"%s: processed: [%6d, %6d)\n","main",
                             local_1540,uVar25 & 0xffffffff);
            }
            lVar18 = lVar18 + local_1470;
            local_1540 = uVar22;
          } while ((long)uVar22 < (long)local_15a0);
        }
        iVar9 = uVar20 - local_15b4;
        if (-0x10 < iVar9) {
          if (-1 < common_log_verbosity_thold) {
            pcVar14 = common_log_main();
            common_log_add(pcVar14,GGML_LOG_LEVEL_INFO,
                           "%s: shifting KV cache with %d to free space for the answer\n","main",
                           (ulong)(iVar9 + 0x10U));
          }
          iVar26 = iVar9 + 0x10U + (int)local_14f0;
          llama_kv_self_seq_rm(plVar28,0,local_14f0,iVar26);
          llama_kv_self_seq_add(plVar28,0,iVar26,local_15b4,-0x10 - iVar9);
          llama_kv_self_update(plVar28);
          iVar9 = llama_kv_self_seq_pos_max(plVar28);
          uVar20 = iVar9 + 1;
        }
        if (-1 < common_log_verbosity_thold) {
          pcVar14 = common_log_main();
          common_log_add(pcVar14,GGML_LOG_LEVEL_INFO,"\n");
          if (-1 < common_log_verbosity_thold) {
            pcVar14 = common_log_main();
            iStack_1630 = (local_1584 * (int)local_1558) / local_1594;
            local_1638[0] = local_1594;
            common_log_add(pcVar14,GGML_LOG_LEVEL_INFO,
                           "%s: passkey = %d, inserted at position %d / %d (token pos: ~%d)\n",
                           "main",(ulong)local_14e8);
            if (-1 < common_log_verbosity_thold) {
              pcVar14 = common_log_main();
              common_log_add(pcVar14,GGML_LOG_LEVEL_INFO,"\n");
              if (-1 < common_log_verbosity_thold) {
                pcVar14 = common_log_main();
                common_log_add(pcVar14,GGML_LOG_LEVEL_INFO,"%s",local_1468[0]);
              }
            }
          }
        }
        local_15a0 = ggml_time_us();
        uVar21 = 0;
        do {
          if ((int)local_14e4 < (int)((int)local_1558 + uVar21)) {
LAB_0012632e:
            plVar28 = local_15b0;
            if (-1 < common_log_verbosity_thold) {
              pcVar14 = common_log_main();
              common_log_add(pcVar14,GGML_LOG_LEVEL_NONE,"\n");
            }
LAB_0012635a:
            lVar18 = ggml_time_us();
            if (-1 < common_log_verbosity_thold) {
              pcVar14 = common_log_main();
              fVar29 = (float)(long)(lVar18 - local_15a0) / 1e+06;
              common_log_add(pcVar14,GGML_LOG_LEVEL_INFO,
                             "%s: decoded %d tokens in %.2f s, speed: %.2f t/s\n",
                             SUB84((double)fVar29,0),SUB84((double)((float)(int)uVar21 / fVar29),0),
                             "main",(ulong)uVar21);
              if (-1 < common_log_verbosity_thold) {
                pcVar14 = common_log_main();
                common_log_add(pcVar14,GGML_LOG_LEVEL_NONE,"\n");
              }
            }
            llama_perf_context_print(plVar28);
            if (-1 < common_log_verbosity_thold) {
              pcVar14 = common_log_main();
              common_log_add(pcVar14,GGML_LOG_LEVEL_NONE,"\n");
            }
            llama_sampler_free(local_14c0);
            local_1608 = local_1530.logits;
            local_1618 = (int)local_1530.n_seq_id;
            uStack_1614 = local_1530.n_seq_id._4_4_;
            uStack_1610 = local_1530.seq_id._0_4_;
            uStack_160c = local_1530.seq_id._4_4_;
            local_1628 = local_1530.embd._0_4_;
            uStack_1624 = local_1530.embd._4_4_;
            iStack_1620 = (int)local_1530.pos;
            uStack_161c = local_1530.pos._4_4_;
            local_1638[0] = local_1530.n_tokens;
            local_1638[1] = local_1530._4_4_;
            iStack_1630 = (int)local_1530.token;
            uStack_162c = local_1530.token._4_4_;
            llama_batch_free();
            llama_free(plVar28);
            llama_model_free(local_1400);
            iVar9 = 0;
            llama_backend_free();
            goto LAB_00126475;
          }
          lVar10 = llama_sampler_sample(local_14c0,local_15b0,local_1530.n_tokens + -1);
          bVar8 = llama_vocab_is_eog(local_13f8);
          if ((bVar8 | uVar21 == 0x10) == 1) {
            plVar28 = local_15b0;
            if (-1 < common_log_verbosity_thold) {
              pcVar14 = common_log_main();
              common_log_add(pcVar14,GGML_LOG_LEVEL_NONE,"\n");
              goto LAB_0012632e;
            }
            goto LAB_0012635a;
          }
          if (-1 < common_log_verbosity_thold) {
            pcVar14 = common_log_main();
            common_token_to_piece_abi_cxx11_(&local_1578,local_15b0,lVar10,true);
            common_log_add(pcVar14,GGML_LOG_LEVEL_NONE,"%s",local_1578._M_dataplus._M_p);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_1578._M_dataplus._M_p != &local_1578.field_2) {
              operator_delete(local_1578._M_dataplus._M_p,
                              local_1578.field_2._M_allocated_capacity + 1);
            }
          }
          common_batch_clear(&local_1530);
          local_14b8[0] = (long *)((ulong)local_14b8[0] & 0xffffffff00000000);
          __l_01._M_len = 1;
          __l_01._M_array = (iterator)local_14b8;
          std::vector<int,_std::allocator<int>_>::vector
                    ((vector<int,_std::allocator<int>_> *)&local_1578,__l_01,
                     (allocator_type *)&local_14e0);
          common_batch_add(&local_1530,lVar10,uVar20 + uVar21,
                           (vector<int,_std::allocator<int>_> *)&local_1578,true);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_1578._M_dataplus._M_p !=
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)0x0) {
            operator_delete(local_1578._M_dataplus._M_p,
                            local_1578.field_2._M_allocated_capacity -
                            (long)local_1578._M_dataplus._M_p);
          }
          local_1608 = local_1530.logits;
          local_1618 = (int)local_1530.n_seq_id;
          uStack_1614 = local_1530.n_seq_id._4_4_;
          uStack_1610 = local_1530.seq_id._0_4_;
          uStack_160c = local_1530.seq_id._4_4_;
          local_1628 = local_1530.embd._0_4_;
          uStack_1624 = local_1530.embd._4_4_;
          iStack_1620 = (int)local_1530.pos;
          uStack_161c = local_1530.pos._4_4_;
          local_1638[0] = local_1530.n_tokens;
          local_1638[1] = local_1530._4_4_;
          iStack_1630 = (int)local_1530.token;
          uStack_162c = local_1530.token._4_4_;
          iVar9 = llama_decode(local_15b0);
          uVar21 = uVar21 + 1;
        } while (iVar9 == 0);
        if (common_log_verbosity_thold < 0) {
          iVar9 = 1;
        }
        else {
          pcVar14 = common_log_main();
          iVar9 = 1;
          common_log_add(pcVar14,GGML_LOG_LEVEL_ERROR,"%s : failed to eval, return code %d\n","main"
                         ,1);
        }
LAB_00126475:
        if (local_14f8 != (float ***)0x0) {
          operator_delete(local_14f8,(long)local_1478 - (long)local_14f8);
        }
      }
    }
    if (local_1468[0] != local_1458) {
      operator_delete(local_1468[0],local_1458[0] + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1498._M_dataplus._M_p != &local_1498.field_2) {
      operator_delete(local_1498._M_dataplus._M_p,local_1498.field_2._M_allocated_capacity + 1);
    }
  }
  common_params::~common_params((common_params *)local_1378);
  return iVar9;
}

Assistant:

int main(int argc, char ** argv) {
    common_params params;

    params.n_junk = 250;
    params.n_keep = 32;
    params.i_pos  = -1;

    if (!common_params_parse(argc, argv, params, LLAMA_EXAMPLE_PASSKEY, print_usage)) {
        return 1;
    }

    common_init();

    int n_junk = params.n_junk;
    int n_keep = params.n_keep;
    int n_grp  = params.grp_attn_n;
    int i_pos  = params.i_pos;

    if (i_pos == -1) {
        i_pos = rand() % n_junk;
    }

    const std::string prompt_prefix = "There is an important info hidden inside a lot of irrelevant text. Find it and memorize them. I will quiz you about the important information there.";
    const std::string prompt_suffix = " What is the pass key? The pass key is";

    // generate junk text
    params.prompt = prompt_prefix;

    const int passkey = rand() % 50000 + 1;

    for (int i = 0; i < n_junk; i++) {
        if (i % n_junk == i_pos) {
            params.prompt += " The pass key is " + std::to_string(passkey) + ". Remember it. " + std::to_string(passkey) + " is the pass key.";
        }

        params.prompt += " The grass is green. The sky is blue. The sun is yellow. Here we go. There and back again.";
    }

    params.prompt += prompt_suffix;

    // init LLM

    llama_backend_init();
    llama_numa_init(params.numa);

    // initialize the model

    llama_model_params model_params = common_model_params_to_llama(params);

    llama_model * model = llama_model_load_from_file(params.model.path.c_str(), model_params);

    if (model == NULL) {
        LOG_ERR("%s: unable to load model\n" , __func__);
        return 1;
    }

    const llama_vocab * vocab = llama_model_get_vocab(model);

    // initialize the context

    llama_context_params ctx_params = common_context_params_to_llama(params);

    ctx_params.n_ctx = llama_model_n_ctx_train(model)*n_grp + n_keep;

    GGML_ASSERT(ctx_params.n_batch % n_grp == 0 && "n_batch must be divisible by n_grp");

    llama_context * ctx = llama_init_from_model(model, ctx_params);
    if (ctx == NULL) {
        LOG_ERR("%s: failed to create the llama_context\n" , __func__);
        return 1;
    }

    auto sparams = llama_sampler_chain_default_params();

    llama_sampler * smpl = llama_sampler_chain_init(sparams);

    llama_sampler_chain_add(smpl, llama_sampler_init_greedy());

    // tokenize the prompt
    std::vector<llama_token> tokens_list;
    tokens_list = common_tokenize(ctx, params.prompt, true);

    // tokenize the prefix and use it as a sink
    const int n_tokens_prefix = common_tokenize(ctx, prompt_prefix, true).size();

    const int n_tokens_all = tokens_list.size();

    // we leave a margin of 16 tokens for the generated text - it should contain just the passkey
    const int n_predict = 16;

    // total length of the sequences including the prompt
    const int n_len = n_tokens_all + n_predict;

    const int n_ctx       = llama_n_ctx(ctx) - n_keep;
    const int n_kv_req    = llama_n_ctx(ctx);
    const int n_batch     = ctx_params.n_batch;
    const int n_batch_grp = ctx_params.n_batch/n_grp;

    LOG_INF("\n%s: n_len = %d, n_ctx = %d, n_kv_req = %d, n_grp = %d, n_batch = %d, n_junk = %d, i_pos = %d\n", __func__, n_len, n_ctx, n_kv_req, n_grp, n_batch, n_junk, i_pos);

    // print the prompt token-by-token

    LOG_INF("\n");
    LOG_INF("prefix tokens: %d\n", n_tokens_prefix);
    LOG_INF("prompt tokens: %d\n", n_tokens_all);
    //LOG_INF("prompt: %s\n", params.prompt.c_str());

    llama_batch batch = llama_batch_init(params.n_batch, 0, 1);

    int n_past = 0;

    // fill the KV cache
    for (int i = 0; i < n_ctx; i += n_batch) {
        if (i > 0 && n_grp > 1) {
            // if SelfExtend is enabled, we compress the position from the last batch by a factor of n_grp
            const int ib = i/n_batch - 1;
            const int bd = n_batch_grp*(n_grp - 1);

            llama_kv_self_seq_add (ctx, 0, n_past - n_batch,         n_past,         ib*bd);
            llama_kv_self_seq_div (ctx, 0, n_past - n_batch + ib*bd, n_past + ib*bd, n_grp);
            llama_kv_self_update  (ctx);

            n_past = llama_kv_self_seq_pos_max(ctx, 0) + 1;
        }

        common_batch_clear(batch);

        for (int j = 0; j < n_batch && i + j < n_tokens_all; j++) {
            common_batch_add(batch, tokens_list[i + j], n_past++, { 0 }, false);
        }

        if (i + n_batch >= n_tokens_all) {
            batch.logits[batch.n_tokens - 1] = true;
        }

        if (llama_decode(ctx, batch) != 0) {
            LOG_INF("%s: llama_decode() failed\n", __func__);
            return 1;
        }

        LOG_INF("%s: processed: [%6d, %6d)\n", __func__, i, std::min(i + n_batch, n_tokens_all));

        if (i + n_batch >= n_tokens_all) {
            break;
        }
    }

    for (int i = n_ctx; i < n_tokens_all; i += n_batch) {
        const int n_discard = n_batch;

        LOG_INF("%s: shifting KV cache with %d\n", __func__, n_discard);

        llama_kv_self_seq_rm (ctx, 0, n_keep            , n_keep + n_discard);
        llama_kv_self_seq_add(ctx, 0, n_keep + n_discard, n_ctx,  -n_discard);
      //llama_kv_self_defrag (ctx);
        llama_kv_self_update (ctx);

        n_past = llama_kv_self_seq_pos_max(ctx, 0) + 1;

        common_batch_clear(batch);

        for (int j = 0; j < n_batch && i + j < n_tokens_all; j++) {
            common_batch_add(batch, tokens_list[i + j], n_past++, { 0 }, false);
        }

        if (i + n_batch >= n_tokens_all) {
            batch.logits[batch.n_tokens - 1] = true;
        }

        if (llama_decode(ctx, batch) != 0) {
            LOG_ERR("%s: llama_decode() failed\n", __func__);
            return 1;
        }

        LOG_INF("%s: processed: [%6d, %6d)\n", __func__, i, std::min(i + n_batch, n_tokens_all));
    }

    {
        const int n_discard = n_past - n_ctx + n_predict;

        if (n_discard > 0) {
            LOG_INF("%s: shifting KV cache with %d to free space for the answer\n", __func__, n_discard);

            llama_kv_self_seq_rm (ctx, 0, n_keep            , n_keep + n_discard);
            llama_kv_self_seq_add(ctx, 0, n_keep + n_discard, n_ctx,  -n_discard);
          //llama_kv_self_defrag (ctx);
            llama_kv_self_update (ctx);

            n_past = llama_kv_self_seq_pos_max(ctx, 0) + 1;
        }
    }

    LOG_INF("\n");
    LOG_INF("%s: passkey = %d, inserted at position %d / %d (token pos: ~%d)\n", __func__, passkey, i_pos, n_junk, (i_pos * n_tokens_all) / n_junk);
    LOG_INF("\n");

    // main loop

    int n_cur    = n_tokens_all;
    int n_decode = 0;

    LOG_INF("%s", prompt_suffix.c_str());

    const auto t_main_start = ggml_time_us();

    while (n_cur <= n_len) {
        // sample the next token
        {
            const llama_token new_token_id = llama_sampler_sample(smpl, ctx, batch.n_tokens - 1);

            // is it an end of generation?
            if (llama_vocab_is_eog(vocab, new_token_id) || n_cur == n_len) {
                LOG("\n");

                break;
            }

            LOG("%s", common_token_to_piece(ctx, new_token_id).c_str());

            n_decode += 1;

            // prepare the next batch
            common_batch_clear(batch);

            // push this new token for next evaluation
            common_batch_add(batch, new_token_id, n_past++, { 0 }, true);
        }

        n_cur += 1;

        // evaluate the current batch with the transformer model
        if (llama_decode(ctx, batch)) {
            LOG_ERR("%s : failed to eval, return code %d\n", __func__, 1);
            return 1;
        }
    }

    LOG("\n");

    const auto t_main_end = ggml_time_us();

    LOG_INF("%s: decoded %d tokens in %.2f s, speed: %.2f t/s\n",
            __func__, n_decode, (t_main_end - t_main_start) / 1000000.0f, n_decode / ((t_main_end - t_main_start) / 1000000.0f));

    LOG("\n");
    llama_perf_context_print(ctx);

    LOG("\n");

    llama_sampler_free(smpl);

    llama_batch_free(batch);

    llama_free(ctx);
    llama_model_free(model);

    llama_backend_free();

    return 0;
}